

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_suite.cpp
# Opt level: O0

void assign_suite::assign_unsigned_int_with_string(void)

{
  type tVar1;
  undefined1 local_11e;
  undefined1 local_11d [2];
  undefined1 local_11b;
  undefined1 local_11a [2];
  undefined1 local_118 [8];
  variable data_3;
  undefined1 local_de;
  undefined1 local_dd;
  uint input_3;
  undefined1 local_d8 [8];
  variable data_2;
  undefined1 local_9e;
  undefined1 local_9d;
  uint input_2;
  undefined1 local_98 [8];
  variable data_1;
  undefined1 local_5f;
  undefined1 local_5e [2];
  uint input_1;
  undefined1 local_4b;
  undefined1 local_4a [2];
  undefined1 local_48 [8];
  variable data;
  uint input;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>
            ((basic_variable<std::allocator<char>_> *)local_48,2);
  local_4a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<int>
                          ((basic_variable<std::allocator<char>_> *)local_48);
  local_4b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xe61,"void assign_suite::assign_unsigned_int_with_string()",local_4a,&local_4b);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator=
            ((basic_variable<std::allocator<char>_> *)local_48,"alpha");
  local_5e[0] = trial::dynamic::basic_variable<std::allocator<char>>::same<std::__cxx11::string>
                          ((basic_variable<std::allocator<char>> *)local_48);
  local_5f = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<variable::string_type>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xe63,"void assign_suite::assign_unsigned_int_with_string()",local_5e,&local_5f);
  tVar1 = trial::dynamic::operator==
                    ((basic_variable<std::allocator<char>_> *)local_48,(char (*) [6])"alpha");
  boost::detail::test_impl
            ("data == \"alpha\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xe64,"void assign_suite::assign_unsigned_int_with_string()",tVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_48);
  data_1.storage._44_4_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>
            ((basic_variable<std::allocator<char>_> *)local_98,2);
  input_2._2_1_ =
       trial::dynamic::basic_variable<std::allocator<char>_>::is<int>
                 ((basic_variable<std::allocator<char>_> *)local_98);
  input_2._1_1_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xe69,"void assign_suite::assign_unsigned_int_with_string()",(long)&input_2 + 2,
             (long)&input_2 + 1);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator=
            ((basic_variable<std::allocator<char>_> *)local_98,L"bravo");
  local_9d = trial::dynamic::basic_variable<std::allocator<char>>::same<std::__cxx11::wstring>
                       ((basic_variable<std::allocator<char>> *)local_98);
  local_9e = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<variable::wstring_type>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xe6b,"void assign_suite::assign_unsigned_int_with_string()",&local_9d,&local_9e);
  tVar1 = trial::dynamic::operator==
                    ((basic_variable<std::allocator<char>_> *)local_98,(wchar_t (*) [6])L"bravo");
  boost::detail::test_impl
            ("data == L\"bravo\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xe6c,"void assign_suite::assign_unsigned_int_with_string()",tVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_98);
  data_2.storage._44_4_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>
            ((basic_variable<std::allocator<char>_> *)local_d8,2);
  input_3._2_1_ =
       trial::dynamic::basic_variable<std::allocator<char>_>::is<int>
                 ((basic_variable<std::allocator<char>_> *)local_d8);
  input_3._1_1_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xe71,"void assign_suite::assign_unsigned_int_with_string()",(long)&input_3 + 2,
             (long)&input_3 + 1);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator=
            ((basic_variable<std::allocator<char>_> *)local_d8,L"charlie");
  local_dd = trial::dynamic::basic_variable<std::allocator<char>>::same<std::__cxx11::u16string>
                       ((basic_variable<std::allocator<char>> *)local_d8);
  local_de = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<variable::u16string_type>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xe73,"void assign_suite::assign_unsigned_int_with_string()",&local_dd,&local_de);
  tVar1 = trial::dynamic::operator==
                    ((basic_variable<std::allocator<char>_> *)local_d8,(char16_t (*) [8])L"charlie")
  ;
  boost::detail::test_impl
            ("data == u\"charlie\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xe74,"void assign_suite::assign_unsigned_int_with_string()",tVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_d8);
  data_3.storage._44_4_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>
            ((basic_variable<std::allocator<char>_> *)local_118,2);
  local_11a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<int>
                           ((basic_variable<std::allocator<char>_> *)local_118);
  local_11b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xe79,"void assign_suite::assign_unsigned_int_with_string()",local_11a,&local_11b);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator=
            ((basic_variable<std::allocator<char>_> *)local_118,L"delta");
  local_11d[0] = trial::dynamic::basic_variable<std::allocator<char>>::same<std::__cxx11::u32string>
                           ((basic_variable<std::allocator<char>> *)local_118);
  local_11e = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<variable::u32string_type>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xe7b,"void assign_suite::assign_unsigned_int_with_string()",local_11d,&local_11e);
  tVar1 = trial::dynamic::operator==
                    ((basic_variable<std::allocator<char>_> *)local_118,(char32_t (*) [6])L"delta");
  boost::detail::test_impl
            ("data == U\"delta\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xe7c,"void assign_suite::assign_unsigned_int_with_string()",tVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_118);
  return;
}

Assistant:

void assign_unsigned_int_with_string()
{
    {
        unsigned int input = 2;
        variable data(input);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<int>(), true);
        data = "alpha";
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<variable::string_type>(), true);
        TRIAL_PROTOCOL_TEST(data == "alpha");
    }
    {
        unsigned int input = 2;
        variable data(input);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<int>(), true);
        data = L"bravo";
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<variable::wstring_type>(), true);
        TRIAL_PROTOCOL_TEST(data == L"bravo");
    }
    {
        unsigned int input = 2;
        variable data(input);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<int>(), true);
        data = u"charlie";
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<variable::u16string_type>(), true);
        TRIAL_PROTOCOL_TEST(data == u"charlie");
    }
    {
        unsigned int input = 2;
        variable data(input);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<int>(), true);
        data = U"delta";
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<variable::u32string_type>(), true);
        TRIAL_PROTOCOL_TEST(data == U"delta");
    }
}